

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void Mf_ObjSetBestCut(int *pCuts,int *pCut)

{
  int iVar1;
  int iVar2;
  int *__src;
  int nSize;
  int nBlock;
  int pTemp [192];
  int *pCut_local;
  int *pCuts_local;
  
  pTemp._760_8_ = pCut;
  if (pCuts < pCut) {
    __src = pCuts + 1;
    if (__src < pCut) {
      iVar1 = (int)((long)pCut - (long)__src >> 2);
      iVar2 = Mf_CutSize(pCut);
      memmove(&nSize,__src,(long)iVar1 << 2);
      memmove(__src,(void *)pTemp._760_8_,(long)(iVar2 + 1) << 2);
      memmove(__src + (iVar2 + 1),&nSize,(long)iVar1 << 2);
    }
    return;
  }
  __assert_fail("pCuts < pCut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                ,0x2ef,"void Mf_ObjSetBestCut(int *, int *)");
}

Assistant:

static inline void Mf_ObjSetBestCut( int * pCuts, int * pCut )
{
    assert( pCuts < pCut );
    if ( ++pCuts < pCut )
    {
        int pTemp[MF_CUT_MAX*(MF_LEAF_MAX+2)];
        int nBlock = pCut - pCuts;
        int nSize = Mf_CutSize(pCut) + 1;
        memmove( pTemp, pCuts, sizeof(int) * nBlock );
        memmove( pCuts, pCut, sizeof(int) * nSize );
        memmove( pCuts + nSize, pTemp, sizeof(int) * nBlock );
    }
}